

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2mem.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char *__filename;
  _Alloc_hider __filename_00;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  FILE *pFVar6;
  FILE *pFVar7;
  size_t i;
  ulong uVar8;
  long lVar9;
  char *__s;
  char *pcVar10;
  int iVar11;
  int EOP;
  FILE *local_348;
  int top_count;
  int bottom_count;
  int blob_index;
  uint local_330;
  int v;
  int blob_count;
  int layer_count;
  FILE *local_320;
  int typeindex;
  int magic;
  char *local_310;
  long local_308;
  char *local_300;
  int id;
  string include_guard_var;
  string parambinpath;
  string param_var;
  char layer_type [33];
  char layer_name [257];
  char bottom_name [257];
  
  if (argc != 5) {
    fprintf(_stderr,"Usage: %s [ncnnproto] [ncnnbin] [idcpppath] [memcpppath]\n",*argv);
    return -1;
  }
  pcVar10 = argv[1];
  pcVar1 = argv[2];
  __filename = argv[3];
  local_310 = argv[4];
  pcVar5 = strrchr(pcVar10,0x2f);
  __s = pcVar5 + 1;
  if (pcVar5 == (char *)0x0) {
    __s = pcVar10;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)layer_name,__s,(allocator<char> *)bottom_name);
  local_300 = pcVar1;
  std::operator+(&parambinpath,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)layer_name,
                 ".bin");
  std::__cxx11::string::~string((string *)layer_name);
  __filename_00 = parambinpath._M_dataplus;
  pFVar6 = fopen(pcVar10,"rb");
  if (pFVar6 == (FILE *)0x0) {
    fprintf(_stderr,"fopen %s failed\n",pcVar10);
    goto LAB_00111bd9;
  }
  local_348 = fopen(__filename_00._M_p,"wb");
  local_320 = fopen(__filename,"wb");
  path_to_varname_abi_cxx11_(&param_var,pcVar10);
  path_to_varname_abi_cxx11_(&include_guard_var,__filename);
  pFVar7 = local_320;
  fprintf(local_320,"#ifndef NCNN_INCLUDE_GUARD_%s\n",include_guard_var._M_dataplus._M_p);
  fprintf(pFVar7,"#define NCNN_INCLUDE_GUARD_%s\n",include_guard_var._M_dataplus._M_p);
  fprintf(pFVar7,"namespace %s_id {\n",param_var._M_dataplus._M_p);
  magic = 0;
  uVar3 = __isoc99_fscanf(pFVar6,"%d");
  if (uVar3 == 1) {
    fwrite(&magic,4,1,local_348);
    layer_count = 0;
    blob_count = 0;
    uVar3 = __isoc99_fscanf(pFVar6,"%d %d");
    pFVar7 = local_348;
    if (uVar3 != 2) {
      pcVar10 = "read layer_count and blob_count failed %d\n";
      goto LAB_00111bb6;
    }
    fwrite(&layer_count,4,1,local_348);
    fwrite(&blob_count,4,1,pFVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&layer_names_abi_cxx11_,(long)layer_count);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&blob_names_abi_cxx11_,(long)blob_count);
    blob_index = 0;
    local_330 = 0;
    for (lVar9 = 0; pFVar7 = local_320, lVar9 < layer_count; lVar9 = lVar9 + 1) {
      bottom_count = 0;
      top_count = 0;
      uVar3 = __isoc99_fscanf(pFVar6,"%32s %256s %d %d",layer_type,layer_name,&bottom_count,
                              &top_count);
      if (uVar3 != 4) {
        pcVar10 = "read layer params failed %d\n";
        goto LAB_00111bb6;
      }
      local_308 = lVar9;
      sanitize_name(layer_name);
      typeindex = ncnn::layer_to_index(layer_type);
      pFVar7 = local_348;
      fwrite(&typeindex,4,1,local_348);
      fwrite(&bottom_count,4,1,pFVar7);
      fwrite(&top_count,4,1,pFVar7);
      fprintf(local_320,"const int LAYER_%s = %d;\n",layer_name,local_308);
      for (iVar11 = 0; iVar11 < bottom_count; iVar11 = iVar11 + 1) {
        uVar3 = __isoc99_fscanf(pFVar6,"%256s",(string *)bottom_name);
        if (uVar3 != 1) {
          pcVar10 = "read bottom_name failed %d\n";
          goto LAB_00111bb6;
        }
        sanitize_name(bottom_name);
        lVar9 = 0;
        for (uVar8 = 0;
            uVar8 < (ulong)((long)blob_names_abi_cxx11_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)blob_names_abi_cxx11_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5); uVar8 = uVar8 + 1
            ) {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&((blob_names_abi_cxx11_.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar9),bottom_name);
          if (bVar2) goto LAB_001118fa;
          lVar9 = lVar9 + 0x20;
        }
        fprintf(_stderr,"find_blob_index_by_name %s failed\n",(string *)bottom_name);
        uVar8 = 0xffffffff;
LAB_001118fa:
        id = (int)uVar8;
        fwrite(&id,4,1,local_348);
      }
      for (iVar11 = 0; iVar11 < top_count; iVar11 = iVar11 + 1) {
        uVar3 = __isoc99_fscanf(pFVar6,"%256s",(string *)bottom_name);
        pFVar7 = local_348;
        if (uVar3 != 1) {
          pcVar10 = "read blob_name failed %d\n";
          goto LAB_00111bb6;
        }
        sanitize_name(bottom_name);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&id,bottom_name,(allocator<char> *)&EOP);
        uVar3 = local_330;
        std::__cxx11::string::operator=
                  ((string *)
                   (blob_names_abi_cxx11_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (int)local_330),(string *)&id);
        std::__cxx11::string::~string((string *)&id);
        fprintf(local_320,"const int BLOB_%s = %d;\n",(string *)bottom_name,(ulong)uVar3);
        fwrite(&blob_index,4,1,pFVar7);
        blob_index = blob_index + 1;
        local_330 = blob_index;
      }
      id = 0;
      while (iVar11 = __isoc99_fscanf(pFVar6,"%d=",&id), iVar11 == 1) {
        fwrite(&id,4,1,local_348);
        if (id < -0x5b03) {
          EOP = 0;
          uVar3 = __isoc99_fscanf(pFVar6,"%d",&EOP);
          if (uVar3 != 1) {
            pcVar10 = "read array length failed %d\n";
            goto LAB_00111bb6;
          }
          fwrite(&EOP,4,1,local_348);
          for (iVar11 = 0; iVar11 < EOP; iVar11 = iVar11 + 1) {
            uVar3 = __isoc99_fscanf(pFVar6,",%15[^,\n ]",(string *)bottom_name);
            if (uVar3 != 1) {
              pcVar10 = "read array element failed %d\n";
              goto LAB_00111bb6;
            }
            bVar2 = vstr_is_float(bottom_name);
            if (bVar2) {
              pcVar10 = "%f";
            }
            else {
              pcVar10 = "%d";
            }
            __isoc99_sscanf((string *)bottom_name,pcVar10,&v);
            fwrite(&v,4,1,local_348);
          }
        }
        else {
          uVar3 = __isoc99_fscanf(pFVar6,"%15s",(string *)bottom_name);
          if (uVar3 != 1) {
            pcVar10 = "read value failed %d\n";
            goto LAB_00111bb6;
          }
          bVar2 = vstr_is_float(bottom_name);
          if (bVar2) {
            pcVar10 = "%f";
          }
          else {
            pcVar10 = "%d";
          }
          __isoc99_sscanf((string *)bottom_name,pcVar10,&EOP);
          fwrite(&EOP,4,1,local_348);
        }
      }
      EOP = -0xe9;
      fwrite(&EOP,4,1,local_348);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)bottom_name,layer_name,(allocator<char> *)&v);
      lVar9 = local_308;
      std::__cxx11::string::operator=
                ((string *)
                 (layer_names_abi_cxx11_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + local_308),(string *)bottom_name);
      std::__cxx11::string::~string((string *)bottom_name);
    }
    fprintf(local_320,"} // namespace %s_id\n",param_var._M_dataplus._M_p,layer_name);
    fprintf(pFVar7,"#endif // NCNN_INCLUDE_GUARD_%s\n",include_guard_var._M_dataplus._M_p);
    fclose(pFVar6);
    fclose(local_348);
    fclose(pFVar7);
  }
  else {
    pcVar10 = "read magic failed %d\n";
LAB_00111bb6:
    fprintf(_stderr,pcVar10,(ulong)uVar3);
  }
  std::__cxx11::string::~string((string *)&include_guard_var);
  std::__cxx11::string::~string((string *)&param_var);
LAB_00111bd9:
  pFVar6 = fopen(local_310,"wb");
  path_to_varname_abi_cxx11_((string *)layer_name,parambinpath._M_dataplus._M_p);
  path_to_varname_abi_cxx11_((string *)bottom_name,local_310);
  pFVar7 = fopen(parambinpath._M_dataplus._M_p,"rb");
  if (pFVar7 == (FILE *)0x0) {
    fprintf(_stderr,"fopen %s failed\n",parambinpath._M_dataplus._M_p);
  }
  else {
    fprintf(pFVar6,"#ifndef NCNN_INCLUDE_GUARD_%s\n",bottom_name._0_8_);
    fprintf(pFVar6,"#define NCNN_INCLUDE_GUARD_%s\n",bottom_name._0_8_);
    fwrite("\n#ifdef _MSC_VER\n__declspec(align(4))\n#else\n__attribute__((aligned(4)))\n#endif\n",
           0x4f,1,pFVar6);
    fprintf(pFVar6,"static const unsigned char %s[] = {\n",layer_name._0_8_);
    uVar3 = 1;
    while ((iVar11 = feof(pFVar7), iVar11 == 0 && (uVar4 = fgetc(pFVar7), uVar4 != 0xffffffff))) {
      fprintf(pFVar6,"0x%02x,",(ulong)uVar4);
      if ((uVar3 & 0xf) == 0) {
        fputc(10,pFVar6);
      }
      uVar3 = uVar3 + 1;
    }
    fwrite("};\n",3,1,pFVar6);
    fclose(pFVar7);
    pcVar10 = local_300;
    path_to_varname_abi_cxx11_((string *)layer_type,local_300);
    pFVar7 = fopen(pcVar10,"rb");
    if (pFVar7 == (FILE *)0x0) {
      fprintf(_stderr,"fopen %s failed\n",pcVar10);
    }
    else {
      fwrite("\n#ifdef _MSC_VER\n__declspec(align(4))\n#else\n__attribute__((aligned(4)))\n#endif\n"
             ,0x4f,1,pFVar6);
      fprintf(pFVar6,"static const unsigned char %s[] = {\n",layer_type._0_8_);
      uVar3 = 1;
      while ((iVar11 = feof(pFVar7), iVar11 == 0 && (uVar4 = fgetc(pFVar7), uVar4 != 0xffffffff))) {
        fprintf(pFVar6,"0x%02x,",(ulong)uVar4);
        if ((uVar3 & 0xf) == 0) {
          fputc(10,pFVar6);
        }
        uVar3 = uVar3 + 1;
      }
      fwrite("};\n",3,1,pFVar6);
      fprintf(pFVar6,"#endif // NCNN_INCLUDE_GUARD_%s\n",bottom_name._0_8_);
      fclose(pFVar7);
      fclose(pFVar6);
    }
    std::__cxx11::string::~string((string *)layer_type);
  }
  std::__cxx11::string::~string((string *)bottom_name);
  std::__cxx11::string::~string((string *)layer_name);
  std::__cxx11::string::~string((string *)&parambinpath);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 5)
    {
        fprintf(stderr, "Usage: %s [ncnnproto] [ncnnbin] [idcpppath] [memcpppath]\n", argv[0]);
        return -1;
    }

    const char* parampath = argv[1];
    const char* modelpath = argv[2];
    const char* idcpppath = argv[3];
    const char* memcpppath = argv[4];

    const char* lastslash = strrchr(parampath, '/');
    const char* name = lastslash == NULL ? parampath : lastslash + 1;

    std::string parambinpath = std::string(name) + ".bin";

    dump_param(parampath, parambinpath.c_str(), idcpppath);

    write_memcpp(parambinpath.c_str(), modelpath, memcpppath);

    return 0;
}